

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEnumerableCore.hpp
# Opt level: O3

size_t __thiscall
linq::IEnumerableCore<linq::IEnumerable<int_&>_>::Count
          (IEnumerableCore<linq::IEnumerable<int_&>_> *this)

{
  bool bVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  iterator __begin0;
  iterator __end0;
  iterator local_68;
  iterator local_48;
  
  begin(&local_68,this);
  end(&local_48,this);
  sVar4 = 0;
  do {
    bVar2 = local_48.valid;
    this_00._M_pi =
         local_48.source.state.super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    bVar1 = local_68.valid;
    if (local_48.source.state.super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if ((local_68.valid == false) && (local_48.valid == false)) goto LAB_0011aca4;
    }
    else {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_48.source.state.super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_48.source.state.
              super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
             ->_M_use_count + 1;
        UNLOCK();
        if (__libc_single_threaded != '\0') goto LAB_0011ac32;
        LOCK();
        (local_48.source.state.super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_48.source.state.
              super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
             ->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_48.source.state.super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_48.source.state.
              super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
             ->_M_use_count + 1;
LAB_0011ac32:
        (local_48.source.state.super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_48.source.state.
              super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
             ->_M_use_count + 1;
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_48.source.state.
                 super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
      if ((bVar1 == false) && (bVar2 == false)) {
        local_48.source.super_IState<int_&>._vptr_IState = (_func_int **)&PTR_Init_00157638;
        if (local_48.source.state.
            super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_48.source.state.
                     super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi);
        }
LAB_0011aca4:
        local_68.source.super_IState<int_&>._vptr_IState = (_func_int **)&PTR_Init_00157638;
        if (local_68.source.state.
            super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_68.source.state.
                     super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi);
        }
        return sVar4;
      }
    }
    (*(local_68.source.state.super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr)->_vptr_IState[3])();
    (*(local_68.source.state.super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr)->_vptr_IState[2])();
    sVar4 = sVar4 + 1;
    iVar3 = (*(local_68.source.state.
               super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              _vptr_IState[1])();
    local_68.valid = SUB41(iVar3,0);
  } while( true );
}

Assistant:

size_t Count() 
		{
			size_t count = 0; 
			
			for(const auto& _ : *this) 
				count++; 
			
			return count;
		}